

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcGraft.c
# Opt level: O0

Vec_Int_t * Sbc_ManWlcNodes2(Wlc_Ntk_t *pNtk,Gia_Man_t *p,Vec_Int_t *vGiaLits)

{
  int iVar1;
  int i_00;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Wlc_Obj_t *pWVar7;
  char *pcVar8;
  word *pTruth;
  word *pInfoObj;
  int iLitOutN;
  int iLitOutP;
  int iLitGia_1;
  int iLitOut;
  int iLitGia;
  Vec_Int_t *vMap;
  Vec_Int_t *vRes;
  int nBits;
  int iFirst;
  int iGiaLit;
  int k;
  int i;
  Wlc_Obj_t *pObj;
  Vec_Int_t *vGiaLits_local;
  Gia_Man_t *p_local;
  Wlc_Ntk_t *pNtk_local;
  
  p_00 = Vec_IntAlloc(100);
  iVar1 = Gia_ManObjNum(p);
  p_01 = Vec_IntStartFull(iVar1);
  for (iGiaLit = 0; iVar1 = Vec_IntSize(vGiaLits), iGiaLit < iVar1; iGiaLit = iGiaLit + 1) {
    iVar1 = Vec_IntEntry(vGiaLits,iGiaLit);
    if (iVar1 != -1) {
      iVar2 = Abc_Lit2Var(iVar1);
      iVar1 = Abc_LitIsCompl(iVar1);
      iVar1 = Abc_Var2Lit(iGiaLit,iVar1);
      Vec_IntWriteEntry(p_01,iVar2,iVar1);
    }
  }
  for (iGiaLit = 1; iVar1 = Wlc_NtkObjNumMax(pNtk), iGiaLit < iVar1; iGiaLit = iGiaLit + 1) {
    pWVar7 = Wlc_NtkObj(pNtk,iGiaLit);
    iVar1 = Vec_IntEntry(&pNtk->vCopies,iGiaLit);
    iVar2 = Wlc_ObjRange(pWVar7);
    for (iFirst = 0; iFirst < iVar2; iFirst = iFirst + 1) {
      iVar4 = Vec_IntEntry(&pNtk->vBits,iVar1 + iFirst);
      iVar5 = Abc_Lit2Var(iVar4);
      iVar5 = Vec_IntEntry(p_01,iVar5);
      if (iVar5 != -1) {
        i_00 = Abc_Lit2Var(iVar4);
        Vec_IntWriteEntry(p_01,i_00,-1);
        iVar4 = Abc_LitIsCompl(iVar4);
        iVar4 = Abc_LitNotCond(iVar5,iVar4);
        uVar3 = Abc_Lit2Var(iVar4);
        uVar6 = Abc_LitIsCompl(iVar4);
        iVar4 = Wlc_ObjId(pNtk,pWVar7);
        pcVar8 = Wlc_ObjName(pNtk,iVar4);
        printf("Matched out %d in phase %d with object %d (%s) bit %d (out of %d).\n",(ulong)uVar3,
               (ulong)uVar6,(ulong)(uint)iGiaLit,pcVar8,(ulong)(uint)iFirst,iVar2);
        Vec_IntPushUnique(p_00,iGiaLit);
      }
    }
  }
  Vec_IntFree(p_01);
  Vec_IntSort(p_00,0);
  iVar1 = Vec_IntEntryLast(p_00);
  pWVar7 = Wlc_NtkObj(pNtk,iVar1);
  iVar1 = Wlc_ObjId(pNtk,pWVar7);
  iVar1 = Vec_IntEntry(&pNtk->vCopies,iVar1);
  iVar2 = Wlc_ObjRange(pWVar7);
  uVar3 = Wlc_ObjId(pNtk,pWVar7);
  iVar4 = Wlc_ObjId(pNtk,pWVar7);
  pcVar8 = Wlc_ObjName(pNtk,iVar4);
  printf("Considering object %d (%s):\n",(ulong)uVar3,pcVar8);
  for (iFirst = 0; iFirst < iVar2; iFirst = iFirst + 1) {
    iVar4 = Vec_IntEntry(&pNtk->vBits,iVar1 + iFirst);
    uVar3 = Vec_IntFind(vGiaLits,iVar4);
    iVar5 = Abc_LitNot(iVar4);
    uVar6 = Vec_IntFind(vGiaLits,iVar5);
    printf("Matching bit %d with output %d / %d.\n",(ulong)(uint)iFirst,(ulong)uVar3,(ulong)uVar6);
    iVar4 = Abc_Lit2Var(iVar4);
    pTruth = Wlc_ObjSim(p,iVar4);
    Extra_PrintHex(_stdout,(uint *)pTruth,6);
    printf("\n");
  }
  return p_00;
}

Assistant:

Vec_Int_t * Sbc_ManWlcNodes2( Wlc_Ntk_t * pNtk, Gia_Man_t * p, Vec_Int_t * vGiaLits )
{
    Wlc_Obj_t * pObj;  int i, k, iGiaLit, iFirst, nBits;
    Vec_Int_t * vRes = Vec_IntAlloc( 100 );
    Vec_Int_t * vMap = Vec_IntStartFull( Gia_ManObjNum(p) );
    Vec_IntForEachEntry( vGiaLits, iGiaLit, i )
        if ( iGiaLit != -1 )
            Vec_IntWriteEntry( vMap, Abc_Lit2Var(iGiaLit), Abc_Var2Lit(i, Abc_LitIsCompl(iGiaLit)) );
    Wlc_NtkForEachObj( pNtk, pObj, i )
    {
        iFirst = Vec_IntEntry( &pNtk->vCopies, i );
        nBits  = Wlc_ObjRange(pObj);
        for ( k = 0; k < nBits; k++ )
        {
            int iLitGia = Vec_IntEntry( &pNtk->vBits, iFirst + k );
            int iLitOut = Vec_IntEntry( vMap, Abc_Lit2Var(iLitGia) );
            if ( iLitOut == -1 )
                continue;
            Vec_IntWriteEntry( vMap, Abc_Lit2Var(iLitGia), -1 );
            iLitOut = Abc_LitNotCond( iLitOut, Abc_LitIsCompl(iLitGia) );
            printf( "Matched out %d in phase %d with object %d (%s) bit %d (out of %d).\n", Abc_Lit2Var(iLitOut), Abc_LitIsCompl(iLitOut), i, Wlc_ObjName(pNtk, Wlc_ObjId(pNtk, pObj)), k, nBits );
            Vec_IntPushUnique( vRes, i );
        }
    }
    Vec_IntFree( vMap );
    Vec_IntSort( vRes, 0 );
    // consider the last one
    pObj   = Wlc_NtkObj( pNtk, Vec_IntEntryLast(vRes) );
    iFirst = Vec_IntEntry( &pNtk->vCopies, Wlc_ObjId(pNtk, pObj) );
    nBits  = Wlc_ObjRange(pObj);
    printf( "Considering object %d (%s):\n", Wlc_ObjId(pNtk, pObj), Wlc_ObjName(pNtk, Wlc_ObjId(pNtk, pObj)) );
    for ( k = 0; k < nBits; k++ )
    {
        int iLitGia  = Vec_IntEntry( &pNtk->vBits, iFirst + k );
        int iLitOutP = Vec_IntFind( vGiaLits, iLitGia );
        int iLitOutN = Vec_IntFind( vGiaLits, Abc_LitNot(iLitGia) );
        printf( "Matching bit %d with output %d / %d.\n", k, iLitOutP, iLitOutN );
        // print simulation signature
        {
            word * pInfoObj = Wlc_ObjSim( p, Abc_Lit2Var(iLitGia) );
            Extra_PrintHex( stdout, (unsigned *)pInfoObj, 6 ); printf( "\n" );
        }
    }
    return vRes;
}